

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_filesystem_joinPath(sysbvm_context_t *context,sysbvm_tuple_t left,sysbvm_tuple_t right)

{
  void *__dest;
  size_t __n;
  void *__src;
  size_t __n_00;
  bool bVar1;
  bool bVar2;
  
  if (((((right & 0xf) != 0 || right == 0) || ((*(uint *)(right + 8) & 0x300) != 0x200)) ||
      (*(int *)(right + 0xc) == 0)) || (*(char *)(right + 0x10) != '/')) {
    bVar1 = (left & 0xf) != 0;
    if ((!bVar1 && left != 0) && ((*(uint *)(left + 8) & 0x300) == 0x200)) {
      bVar2 = (right & 0xf) != 0;
      if ((!bVar2 && right != 0) && ((*(uint *)(right + 8) & 0x300) == 0x200)) {
        if (bVar1 || left == 0) {
          __n_00 = 0;
        }
        else {
          __n_00 = (size_t)*(uint *)(left + 0xc);
        }
        if (bVar2 || right == 0) {
          __n = 0;
        }
        else {
          __n = (size_t)*(uint *)(right + 0xc);
        }
        if (__n_00 == 0) {
          bVar1 = false;
        }
        else {
          bVar1 = *(char *)(left + 0xf + __n_00) == '/';
        }
        __src = (void *)(right + 0x10);
        right = sysbvm_string_createEmptyWithSize(context,(bVar1 ^ 1) + __n + __n_00);
        __dest = (void *)(right + 0x10);
        memcpy(__dest,(void *)(left + 0x10),__n_00);
        if (bVar1 == false) {
          *(undefined1 *)((long)__dest + __n_00) = 0x2f;
          __n_00 = __n_00 + 1;
        }
        memcpy((void *)((long)__dest + __n_00),__src,__n);
      }
    }
  }
  return right;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_filesystem_joinPath(sysbvm_context_t *context, sysbvm_tuple_t left, sysbvm_tuple_t right)
{
    if(sysbvm_filesystem_isAbsolute(right) || !sysbvm_tuple_isBytes(left) || !sysbvm_tuple_isBytes(right))
        return right;

    size_t leftSize = sysbvm_tuple_getSizeInBytes(left);
    uint8_t *leftBytes = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(left)->bytes;

    size_t rightSize = sysbvm_tuple_getSizeInBytes(right);
    uint8_t *rightBytes = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(right)->bytes;

    bool hasSeparator = false;
    if(leftSize > 0)
    {
        uint8_t lastCharacter = leftBytes[leftSize - 1];
#ifdef _WIN32
        hasSeparator = lastCharacter == '/' || lastCharacter == '\\';
#else
        hasSeparator = lastCharacter == '/';
#endif
    }

    size_t resultSize = leftSize + (hasSeparator ? 0 : 1) + rightSize;
    sysbvm_tuple_t result = sysbvm_string_createEmptyWithSize(context, resultSize);

    size_t destIndex = 0;
    uint8_t *destBytes = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(result)->bytes;

    memcpy(destBytes, leftBytes, leftSize);
    destIndex += leftSize;

    if(!hasSeparator)
        destBytes[destIndex++] = '/';

    memcpy(destBytes + destIndex, rightBytes, rightSize);
    return result;
}